

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteGetFuncType(CWriter *this)

{
  FuncSignature *this_00;
  bool bVar1;
  vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_> *this_01;
  reference ppTVar2;
  TypeVector *this_02;
  Newline local_e2;
  CloseBrace local_e1;
  Newline local_e0;
  Newline local_df;
  Newline local_de;
  CloseBrace local_dd;
  Newline local_dc;
  Newline local_db;
  CloseBrace local_da;
  Newline local_d9;
  FuncTypeExpr local_d8;
  Newline local_ca;
  OpenBrace local_c9;
  Type local_c8;
  TypeEnum local_c0;
  reference local_b8;
  Type *t_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  TypeVector *__range3_1;
  TypeEnum local_90;
  reference local_88;
  Type *t;
  const_iterator __end3;
  const_iterator __begin3;
  TypeVector *__range3;
  Newline local_56;
  OpenBrace local_55;
  Index local_54;
  Index local_50;
  Newline local_49;
  FuncSignature *local_48;
  FuncSignature *signature;
  FuncType *func_type;
  TypeEntry *type;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_> *__range2;
  CWriter *local_10;
  CWriter *this_local;
  
  local_10 = this;
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::Newline,char_const(&)[21],char_const(&)[8],std::__cxx11::string&,char_const(&)[66],wabt::(anonymous_namespace)::OpenBrace>
            ((CWriter *)this,(Newline *)((long)&__range2 + 7),(char (*) [21])"wasm_rt_func_type_t ",
             (char (*) [8])"wasm2c_",&this->module_prefix_,
             (char (*) [66])"_get_func_type(uint32_t param_count, uint32_t result_count, ...) ",
             (OpenBrace *)((long)&__range2 + 6));
  (anonymous_namespace)::CWriter::Write<char_const(&)[14],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [14])"va_list args;",(Newline *)((long)&__range2 + 5));
  this_01 = &this->module_->types;
  __end2 = std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>::begin(this_01);
  type = (TypeEntry *)
         std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::TypeEntry_*const_*,_std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>_>
                                *)&type);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<wabt::TypeEntry_*const_*,_std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>_>
              ::operator*(&__end2);
    func_type = (FuncType *)*ppTVar2;
    signature = (FuncSignature *)cast<wabt::FuncType,wabt::TypeEntry>((TypeEntry *)func_type);
    local_48 = &((FuncType *)signature)->sig;
    local_50 = FuncSignature::GetNumParams(local_48);
    local_54 = FuncSignature::GetNumResults(local_48);
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::Newline,char_const(&)[20],unsigned_int,char_const(&)[21],unsigned_int,char_const(&)[3],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,&local_49,(char (*) [20])"if (param_count == ",&local_50,
               (char (*) [21])" && result_count == ",&local_54,(char (*) [3])0x221d30,&local_55);
    (anonymous_namespace)::CWriter::Write<char_const(&)[30],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [30])"va_start(args, result_count);",&local_56);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,"if (true");
    Write(this,___range3);
    this_00 = local_48;
    __end3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin(&local_48->param_types);
    t = (Type *)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end(&this_00->param_types);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
                                  *)&t);
      if (!bVar1) break;
      local_88 = __gnu_cxx::
                 __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
                 ::operator*(&__end3);
      TypeEnum::TypeEnum(&local_90,*local_88);
      (anonymous_namespace)::CWriter::Write<char_const(&)[37],wabt::(anonymous_namespace)::TypeEnum>
                ((CWriter *)this,(char (*) [37])" && va_arg(args, wasm_rt_type_t) == ",&local_90);
      __gnu_cxx::
      __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>::
      operator++(&__end3);
    }
    this_02 = &local_48->result_types;
    __end3_1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin(this_02);
    t_1 = (Type *)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end(this_02);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3_1,
                         (__normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
                          *)&t_1);
      if (!bVar1) break;
      local_b8 = __gnu_cxx::
                 __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
                 ::operator*(&__end3_1);
      local_c8 = *local_b8;
      TypeEnum::TypeEnum(&local_c0,local_c8);
      (anonymous_namespace)::CWriter::Write<char_const(&)[37],wabt::(anonymous_namespace)::TypeEnum>
                ((CWriter *)this,(char (*) [37])" && va_arg(args, wasm_rt_type_t) == ",&local_c0);
      __gnu_cxx::
      __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>::
      operator++(&__end3_1);
    }
    (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,(char (*) [3])0x221d30,&local_c9);
    (anonymous_namespace)::CWriter::Write<char_const(&)[14],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [14])"va_end(args);",&local_ca);
    FuncTypeExpr::FuncTypeExpr(&local_d8,(FuncType *)signature);
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[8],wabt::(anonymous_namespace)::FuncTypeExpr,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [8])"return ",&local_d8,(char (*) [2])0x21ded1,&local_d9);
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,&local_da,&local_db);
    (anonymous_namespace)::CWriter::Write<char_const(&)[14],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [14])"va_end(args);",&local_dc);
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,&local_dd,&local_de);
    __gnu_cxx::
    __normal_iterator<wabt::TypeEntry_*const_*,_std::vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>_>
    ::operator++(&__end2);
  }
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::Newline,char_const(&)[13],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_df,(char (*) [13])"return NULL;",&local_e0);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_e1,&local_e2);
  return;
}

Assistant:

void CWriter::WriteGetFuncType() {
  Write(Newline(), "wasm_rt_func_type_t ", kAdminSymbolPrefix, module_prefix_,
        "_get_func_type(uint32_t param_count, uint32_t result_count, "
        "...) ",
        OpenBrace());

  Write("va_list args;", Newline());

  for (const TypeEntry* type : module_->types) {
    const FuncType* func_type = cast<FuncType>(type);
    const FuncSignature& signature = func_type->sig;

    Write(Newline(), "if (param_count == ", signature.GetNumParams(),
          " && result_count == ", signature.GetNumResults(), ") ", OpenBrace());
    Write("va_start(args, result_count);", Newline());
    Write("if (true");
    for (const auto& t : signature.param_types) {
      Write(" && va_arg(args, wasm_rt_type_t) == ", TypeEnum(t));
    }
    for (const auto& t : signature.result_types) {
      Write(" && va_arg(args, wasm_rt_type_t) == ", TypeEnum(t));
    }
    Write(") ", OpenBrace());
    Write("va_end(args);", Newline());
    Write("return ", FuncTypeExpr(func_type), ";", Newline());
    Write(CloseBrace(), Newline());
    Write("va_end(args);", Newline());
    Write(CloseBrace(), Newline());
  }

  Write(Newline(), "return NULL;", Newline());
  Write(CloseBrace(), Newline());
}